

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::TextureCube::sample4(TextureCube *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  int iVar1;
  CubeFace face_00;
  float fVar2;
  float fVar3;
  float p_00;
  Vec2 *local_c0;
  Vector<float,_2> *local_b8;
  undefined1 local_a8 [24];
  float lod;
  float p;
  float mv;
  float mu;
  Vec2 *dFdy;
  Vec2 *dFdx;
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  Vec2 coords [4];
  uint local_2c;
  CubeFace face;
  int fragNdx;
  float cubeSide;
  float lodBias_local;
  Vec3 *packetTexcoords_local;
  Vec4 *output_local;
  TextureCube *this_local;
  
  iVar1 = tcu::TextureCubeView::getSize(&this->m_view);
  for (local_2c = 0; (int)local_2c < 4; local_2c = local_2c + 1) {
    face_00 = tcu::selectCubeFace(packetTexcoords + (int)local_2c);
    tcu::projectToFace((tcu *)&dFdx0,face_00,packetTexcoords);
    tcu::projectToFace((tcu *)coords,face_00,packetTexcoords + 1);
    tcu::projectToFace((tcu *)(coords + 1),face_00,packetTexcoords + 2);
    tcu::projectToFace((tcu *)(coords + 2),face_00,packetTexcoords + 3);
    tcu::operator-((tcu *)&dFdx1,coords,&dFdx0);
    tcu::operator-((tcu *)&dFdy0,coords + 2,coords + 1);
    tcu::operator-((tcu *)&dFdy1,coords + 1,&dFdx0);
    tcu::operator-((tcu *)&dFdx,coords + 2,coords);
    if ((local_2c & 2) == 0) {
      local_b8 = &dFdx1;
    }
    else {
      local_b8 = &dFdy0;
    }
    dFdy = local_b8;
    if ((local_2c & 1) == 0) {
      local_c0 = &dFdy1;
    }
    else {
      local_c0 = (Vec2 *)&dFdx;
    }
    _mv = local_c0;
    fVar2 = tcu::Vector<float,_2>::x(local_b8);
    fVar2 = de::abs<float>(fVar2);
    fVar3 = tcu::Vector<float,_2>::x(_mv);
    fVar3 = de::abs<float>(fVar3);
    p = de::max<float>(fVar2,fVar3);
    fVar2 = tcu::Vector<float,_2>::y(dFdy);
    fVar2 = de::abs<float>(fVar2);
    fVar3 = tcu::Vector<float,_2>::y(_mv);
    fVar3 = de::abs<float>(fVar3);
    lod = de::max<float>(fVar2,fVar3);
    local_a8._20_4_ = de::max<float>(p * (float)iVar1,lod * (float)iVar1);
    local_a8._16_4_ = deFloatLog2((float)local_a8._20_4_);
    local_a8._16_4_ = (float)local_a8._16_4_ + lodBias;
    fVar2 = tcu::Vector<float,_3>::x(packetTexcoords + (int)local_2c);
    fVar3 = tcu::Vector<float,_3>::y(packetTexcoords + (int)local_2c);
    p_00 = tcu::Vector<float,_3>::z(packetTexcoords + (int)local_2c);
    sample((TextureCube *)local_a8,fVar2,fVar3,p_00,(float)local_a8._16_4_);
    *(undefined8 *)output[(int)local_2c].m_data = local_a8._0_8_;
    *(undefined8 *)(output[(int)local_2c].m_data + 2) = local_a8._8_8_;
  }
  return;
}

Assistant:

void TextureCube::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float cubeSide = (float)m_view.getSize();

	// Each tex coord might be in a different face.

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face		= tcu::selectCubeFace(packetTexcoords[fragNdx]);
		const tcu::Vec2		coords[4]	=
		{
			tcu::projectToFace(face, packetTexcoords[0]),
			tcu::projectToFace(face, packetTexcoords[1]),
			tcu::projectToFace(face, packetTexcoords[2]),
			tcu::projectToFace(face, packetTexcoords[3]),
		};

		const tcu::Vec2 dFdx0 = coords[1] - coords[0];
		const tcu::Vec2 dFdx1 = coords[3] - coords[2];
		const tcu::Vec2 dFdy0 = coords[2] - coords[0];
		const tcu::Vec2 dFdy1 = coords[3] - coords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}